

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O1

void __thiscall osqp::anon_unknown_0::TwoDimensionalQpTest::SetUp(TwoDimensionalQpTest *this)

{
  undefined8 *puVar1;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult gtest_ar_;
  OsqpInstance instance;
  Triplet<double,_int> kTripletsA [1];
  SparseMatrix<double,_0,_int> constraint_matrix;
  SparseMatrix<double,_0,_int> objective_matrix;
  OsqpSettings settings;
  Triplet<double,_int> kTripletsP [4];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_298;
  AssertHelper local_290;
  internal local_288 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  string local_278;
  undefined1 local_258 [24];
  StorageIndex *pSStack_240;
  StorageIndex *local_238;
  CompressedStorage<double,_long_long> CStack_230;
  undefined8 *local_210;
  double dStack_208;
  SparseMatrix<double,_0,_long_long> local_200;
  undefined8 *local_1b8;
  long lStack_1b0;
  undefined8 *local_1a8;
  long lStack_1a0;
  undefined8 local_198;
  undefined8 local_190;
  SparseMatrix<double,_0,_int> local_188;
  SparseMatrix<double,_0,_int> local_140;
  OsqpSettings local_f8;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_140.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_140.m_outerSize = 0;
  local_140.m_innerSize = 0;
  local_140.m_outerIndex = (StorageIndex *)0x0;
  local_140.m_innerNonZeros = (StorageIndex *)0x0;
  local_140.m_data.m_values = (Scalar *)0x0;
  local_140.m_data.m_indices = (StorageIndex_conflict *)0x0;
  local_140.m_data.m_size = 0;
  local_140.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_140,2,2);
  local_258._0_8_ = &local_58;
  local_58 = 0;
  local_50 = 0x4000000000000000;
  local_48 = 1;
  local_40 = 0x3fe0000000000000;
  local_38 = 0x100000000;
  local_30 = 0x3fe0000000000000;
  local_28 = 0x100000001;
  local_20 = 0x4000000000000000;
  local_f8.rho = (double)&stack0xffffffffffffffe8;
  Eigen::internal::
  set_from_triplets<Eigen::Triplet<double,int>const*,Eigen::SparseMatrix<double,0,int>,Eigen::internal::scalar_sum_op<double,double>>
            (local_258,&local_f8,&local_140,&local_188);
  local_188.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_188.m_outerSize = 0;
  local_188.m_innerSize = 0;
  local_188.m_outerIndex = (StorageIndex *)0x0;
  local_188.m_innerNonZeros = (StorageIndex *)0x0;
  local_188.m_data.m_values = (Scalar *)0x0;
  local_188.m_data.m_indices = (StorageIndex_conflict *)0x0;
  local_188.m_data.m_size = 0;
  local_188.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_188,1,2);
  local_258._0_8_ = &local_198;
  local_198 = 0;
  local_190 = 0x3ff0000000000000;
  local_f8.rho = (double)&local_188;
  Eigen::internal::
  set_from_triplets<Eigen::Triplet<double,int>const*,Eigen::SparseMatrix<double,0,int>,Eigen::internal::scalar_sum_op<double,double>>
            (local_258,&local_f8,&local_188);
  local_258._0_8_ = local_258._0_8_ & 0xffffffffffffff00;
  local_258._8_8_ = -NAN;
  local_258._16_8_ = 0;
  pSStack_240 = (StorageIndex *)0x0;
  local_238 = (StorageIndex *)0x0;
  CStack_230.m_values = (Scalar *)0x0;
  CStack_230.m_indices = (StorageIndex *)0x0;
  CStack_230.m_size = 0;
  CStack_230.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_long_long>::resize
            ((SparseMatrix<double,_0,_long_long> *)local_258,0,0);
  local_210 = (undefined8 *)0x0;
  dStack_208 = 0.0;
  local_200.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>)false;
  local_200.m_outerSize = -1;
  local_200.m_innerSize = 0;
  local_200.m_outerIndex = (StorageIndex *)0x0;
  local_200.m_innerNonZeros = (StorageIndex *)0x0;
  local_200.m_data.m_values = (Scalar *)0x0;
  local_200.m_data.m_indices = (StorageIndex *)0x0;
  local_200.m_data.m_size = 0;
  local_200.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_long_long>::resize(&local_200,0,0);
  local_1a8 = (undefined8 *)0x0;
  lStack_1a0 = 0;
  local_1b8 = (undefined8 *)0x0;
  lStack_1b0 = 0;
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)local_258,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&local_140);
  puVar1 = local_210;
  if (dStack_208 != 9.88131291682493e-324) {
    free(local_210);
    puVar1 = (undefined8 *)malloc(0x10);
    if (((ulong)puVar1 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (puVar1 == (undefined8 *)0x0) goto LAB_0011f9b4;
  }
  local_210 = puVar1;
  local_f8.rho = (double)&local_210;
  dStack_208 = 9.88131291682493e-324;
  local_f8.sigma = 0.0;
  local_f8.scaling = 1;
  local_f8._24_8_ = 1;
  *local_210 = 0;
  local_278._M_dataplus._M_p = (pointer)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_f8,
             (Scalar *)&local_278);
  if ((local_f8._24_8_ + (long)local_f8.sigma != *(Index *)((long)local_f8.rho + 8)) ||
     (local_f8.scaling != 1)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)&local_200,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&local_188);
  puVar1 = local_1b8;
  if (lStack_1b0 != 1) {
    free(local_1b8);
    puVar1 = (undefined8 *)malloc(8);
    if (puVar1 == (undefined8 *)0x0) goto LAB_0011f9b4;
  }
  local_1b8 = puVar1;
  lStack_1b0 = 1;
  *local_1b8 = 0x3ff0000000000000;
  puVar1 = local_1a8;
  if (lStack_1a0 != 1) {
    free(local_1a8);
    puVar1 = (undefined8 *)malloc(8);
    if (puVar1 == (undefined8 *)0x0) {
LAB_0011f9b4:
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = execv;
      __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_1a8 = puVar1;
  lStack_1a0 = 1;
  *local_1a8 = 0x7ff0000000000000;
  OsqpSettings::OsqpSettings(&local_f8);
  local_f8.eps_abs = 1.0000000000000002e-06;
  local_f8.eps_rel = 0.0;
  local_f8.check_termination = 1;
  OsqpSolver::Init((OsqpSolver *)&local_278,(OsqpInstance *)&this->solver_,(OsqpSettings *)local_258
                  );
  local_288[0] = (internal)((StatusRep *)local_278._M_dataplus._M_p == (StatusRep *)0x1);
  local_280 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)local_278._M_dataplus._M_p & 1) == 0) {
    absl::status_internal::StatusRep::Unref((StatusRep *)local_278._M_dataplus._M_p);
  }
  if (local_288[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_278,local_288,(AssertionResult *)"solver_.Init(instance, settings).ok()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x145,local_278._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_298._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_298._M_head_impl + 8))();
    }
  }
  if (local_280 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_280,local_280);
  }
  free(local_1a8);
  free(local_1b8);
  free(local_200.m_outerIndex);
  free(local_200.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_200.m_data);
  free(local_210);
  free(pSStack_240);
  free(local_238);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&CStack_230);
  free(local_188.m_outerIndex);
  free(local_188.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_188.m_data);
  free(local_140.m_outerIndex);
  free(local_140.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_140.m_data);
  return;
}

Assistant:

void SetUp() override {
    // Minimize x^2 + (1/2)xy + y^2 subject to x >= 1.
    SparseMatrix<double> objective_matrix(2, 2);
    const Triplet<double> kTripletsP[] = {
        {0, 0, 2.0}, {1, 0, 0.5}, {0, 1, 0.5}, {1, 1, 2.0}};
    objective_matrix.setFromTriplets(std::begin(kTripletsP),
                                     std::end(kTripletsP));

    SparseMatrix<double> constraint_matrix(1, 2);
    const Triplet<double> kTripletsA[] = {{0, 0, 1.0}};
    constraint_matrix.setFromTriplets(std::begin(kTripletsA),
                                      std::end(kTripletsA));

    OsqpInstance instance;
    instance.objective_matrix = objective_matrix;
    instance.objective_vector.resize(2);
    instance.objective_vector << 0.0, 0.0;
    instance.constraint_matrix = constraint_matrix;
    instance.lower_bounds.resize(1);
    instance.lower_bounds << 1.0;
    instance.upper_bounds.resize(1);
    instance.upper_bounds << kInfinity;

    OsqpSettings settings;
    settings.eps_abs = kTolerance / 10;
    settings.eps_rel = 0.0;
    // check_termination is set so that the warm-started instance converges
    // immediately.
    settings.check_termination = 1;
    ASSERT_TRUE(solver_.Init(instance, settings).ok());
  }